

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O1

bool __thiscall PDA::addTransition(PDA *this,Transition *transition)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  bool bVar7;
  char *pcVar8;
  Transition *local_c0;
  char *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  Transition *local_38;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar2 = (transition->stateFrom->name)._M_dataplus._M_p;
  local_c0 = transition;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + (transition->stateFrom->name)._M_string_length);
  bVar3 = containsState(this,&local_90);
  if (bVar3) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    pcVar2 = (local_c0->stateTo->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + (local_c0->stateTo->name)._M_string_length);
    bVar4 = containsState(this,&local_b0);
    if (!bVar4) goto LAB_00106c89;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_50,&local_c0->stackPush);
    bVar5 = inStackAlphabet(this,&local_50);
    bVar4 = true;
    if (bVar5) {
      pcVar8 = (this->inputAlphabetS).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_b8 = (this->inputAlphabetS).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      bVar5 = pcVar8 != local_b8;
      if ((bVar5) && (cVar1 = local_c0->input, *pcVar8 != cVar1)) {
        while( true ) {
          pcVar8 = pcVar8 + 1;
          cVar6 = getEPSILON();
          if (cVar6 == cVar1) break;
          bVar5 = pcVar8 != local_b8;
          if ((pcVar8 == local_b8) || (*pcVar8 == cVar1)) break;
        }
      }
      if (bVar5) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar2 = (local_c0->stackInput)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar2,pcVar2 + (local_c0->stackInput)._M_string_length);
        bVar7 = inStackAlphabet(this,&local_70);
        bVar4 = true;
        bVar5 = true;
        goto LAB_00106c91;
      }
    }
  }
  else {
LAB_00106c89:
    bVar4 = false;
  }
  bVar5 = false;
  bVar7 = false;
LAB_00106c91:
  if ((bVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_50);
  }
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2)) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (bVar7 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error adding transition",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
  }
  else {
    std::vector<Transition*,std::allocator<Transition*>>::emplace_back<Transition*&>
              ((vector<Transition*,std::allocator<Transition*>> *)&this->transitionFunctionD,
               &local_c0);
    local_38 = local_c0;
    std::vector<Transition*,std::allocator<Transition*>>::emplace_back<Transition*&>
              ((vector<Transition*,std::allocator<Transition*>> *)
               &local_c0->stateFrom->transitionsFrom,&local_38);
  }
  return bVar7;
}

Assistant:

bool PDA::addTransition(Transition *transition) {
    if (containsState(transition->getStateFrom()->getName()) &&
        containsState(transition->getStateTo()->getName()) &&
        inStackAlphabet(transition->getStackPush()) &&
        inAlphabet(transition->getInput()) &&
        inStackAlphabet(transition->getStackInput())) {
        transitionFunctionD.emplace_back(transition);
        transition->getStateFrom()->addTransition(transition);
        return true;
    } else {
        std::cerr << "Error adding transition" << std::endl;
    }
    return false;
}